

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

ElementsDecodeRawTransactionTxOutStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertToStruct
          (ElementsDecodeRawTransactionTxOut *this)

{
  long in_RSI;
  ElementsDecodeRawTransactionTxOutStruct *in_RDI;
  ElementsDecodeRawTransactionTxOutStruct *result;
  ElementsDecodeLockingScriptStruct *pEVar1;
  ElementsDecodeRawTransactionTxOutStruct *this_00;
  ElementsDecodeLockingScript *in_stack_fffffffffffffed8;
  ElementsDecodeRawTransactionTxOutStruct *in_stack_fffffffffffffef0;
  
  this_00 = in_RDI;
  ElementsDecodeRawTransactionTxOutStruct::ElementsDecodeRawTransactionTxOutStruct
            (in_stack_fffffffffffffef0);
  in_RDI->value = *(int64_t *)(in_RSI + 0x38);
  in_RDI->value_minimum = *(int64_t *)(in_RSI + 0x40);
  in_RDI->value_maximum = *(int64_t *)(in_RSI + 0x48);
  in_RDI->ct_exponent = *(int *)(in_RSI + 0x50);
  in_RDI->ct_bits = *(int *)(in_RSI + 0x54);
  std::__cxx11::string::operator=((string *)&in_RDI->surjectionproof,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator=((string *)&in_RDI->valuecommitment,(string *)(in_RSI + 0x78));
  std::__cxx11::string::operator=((string *)&in_RDI->asset,(string *)(in_RSI + 0x98));
  std::__cxx11::string::operator=((string *)&in_RDI->assetcommitment,(string *)(in_RSI + 0xb8));
  std::__cxx11::string::operator=((string *)&in_RDI->commitmentnonce,(string *)(in_RSI + 0xd8));
  in_RDI->commitmentnonce_fully_valid = (bool)(*(byte *)(in_RSI + 0xf8) & 1);
  in_RDI->n = *(uint32_t *)(in_RSI + 0xfc);
  ElementsDecodeLockingScript::ConvertToStruct(in_stack_fffffffffffffed8);
  pEVar1 = (ElementsDecodeLockingScriptStruct *)&stack0xfffffffffffffe88;
  ElementsDecodeLockingScriptStruct::operator=((ElementsDecodeLockingScriptStruct *)this_00,pEVar1);
  ElementsDecodeLockingScriptStruct::~ElementsDecodeLockingScriptStruct
            ((ElementsDecodeLockingScriptStruct *)this_00);
  std::__cxx11::string::operator=((string *)&in_RDI->rangeproof,(string *)(in_RSI + 0x268));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pEVar1);
  return this_00;
}

Assistant:

ElementsDecodeRawTransactionTxOutStruct ElementsDecodeRawTransactionTxOut::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionTxOutStruct result;
  result.value = value_;
  result.value_minimum = value_minimum_;
  result.value_maximum = value_maximum_;
  result.ct_exponent = ct_exponent_;
  result.ct_bits = ct_bits_;
  result.surjectionproof = surjectionproof_;
  result.valuecommitment = valuecommitment_;
  result.asset = asset_;
  result.assetcommitment = assetcommitment_;
  result.commitmentnonce = commitmentnonce_;
  result.commitmentnonce_fully_valid = commitmentnonce_fully_valid_;
  result.n = n_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.rangeproof = rangeproof_;
  result.ignore_items = ignore_items;
  return result;
}